

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThan,false,false,true,false>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  long lVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  sel_t sVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  
  if (count + 0x3f < 0x40) {
    iVar6 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar6 = 0;
    uVar10 = 0;
    uVar14 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar12 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar12 = count;
        }
LAB_0042e516:
        uVar5 = uVar14;
        if (uVar14 < uVar12) {
          psVar2 = sel->sel_vector;
          psVar3 = true_sel->sel_vector;
          uVar18 = uVar14 << 4 | 8;
          do {
            uVar5 = uVar14;
            if (psVar2 != (sel_t *)0x0) {
              uVar5 = (ulong)psVar2[uVar14];
            }
            lVar4 = *(long *)((long)&ldata->months + uVar18);
            lVar15 = (long)*(int *)((long)ldata + (uVar18 - 4)) + lVar4 / 86400000000;
            lVar17 = lVar15 % 0x1e;
            lVar13 = (long)*(int *)((long)ldata + (uVar18 - 8)) + lVar15 / 0x1e;
            lVar15 = *(long *)((long)&rdata->months + uVar18);
            lVar16 = (long)*(int *)((long)rdata + (uVar18 - 4)) + lVar15 / 86400000000;
            lVar11 = lVar16 % 0x1e;
            lVar16 = (long)*(int *)((long)rdata + (uVar18 - 8)) + lVar16 / 0x1e;
            uVar7 = 1;
            if (lVar13 <= lVar16) {
              if (lVar13 < lVar16) {
                uVar7 = 0;
              }
              else if (lVar17 <= lVar11) {
                uVar7 = (ulong)(lVar15 % 86400000000 < lVar4 % 86400000000 && lVar11 <= lVar17);
              }
            }
            psVar3[iVar6] = (sel_t)uVar5;
            iVar6 = uVar7 + iVar6;
            uVar14 = uVar14 + 1;
            uVar18 = uVar18 + 0x10;
            uVar5 = uVar12;
          } while (uVar12 != uVar14);
        }
      }
      else {
        uVar18 = puVar1[uVar10];
        uVar12 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar12 = count;
        }
        uVar5 = uVar12;
        if (uVar18 != 0) {
          if (uVar18 == 0xffffffffffffffff) goto LAB_0042e516;
          uVar5 = uVar14;
          if (uVar14 < uVar12) {
            psVar2 = sel->sel_vector;
            psVar3 = true_sel->sel_vector;
            uVar7 = uVar14 << 4 | 8;
            uVar8 = 0;
            do {
              if (psVar2 == (sel_t *)0x0) {
                sVar9 = (int)uVar14 + (int)uVar8;
              }
              else {
                sVar9 = psVar2[uVar14 + uVar8];
              }
              if ((uVar18 >> (uVar8 & 0x3f) & 1) == 0) {
                uVar5 = 0;
              }
              else {
                lVar4 = *(long *)((long)&ldata->months + uVar7);
                lVar15 = (long)*(int *)((long)ldata + (uVar7 - 4)) + lVar4 / 86400000000;
                lVar17 = lVar15 % 0x1e;
                lVar13 = (long)*(int *)((long)ldata + (uVar7 - 8)) + lVar15 / 0x1e;
                lVar15 = *(long *)((long)&rdata->months + uVar7);
                lVar16 = (long)*(int *)((long)rdata + (uVar7 - 4)) + lVar15 / 86400000000;
                lVar11 = lVar16 % 0x1e;
                lVar16 = (long)*(int *)((long)rdata + (uVar7 - 8)) + lVar16 / 0x1e;
                uVar5 = 1;
                if (lVar13 <= lVar16) {
                  if (lVar13 < lVar16) {
                    uVar5 = 0;
                  }
                  else if (lVar17 <= lVar11) {
                    uVar5 = (ulong)(lVar15 % 86400000000 < lVar4 % 86400000000 && lVar11 <= lVar17);
                  }
                }
              }
              psVar3[iVar6] = sVar9;
              iVar6 = uVar5 + iVar6;
              uVar8 = uVar8 + 1;
              uVar7 = uVar7 + 0x10;
              uVar5 = uVar12;
            } while (uVar12 - uVar14 != uVar8);
          }
        }
      }
      uVar10 = uVar10 + 1;
      uVar14 = uVar5;
    } while (uVar10 != count + 0x3f >> 6);
  }
  return iVar6;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}